

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

bool __thiscall SimpleString::containsNoCase(SimpleString *this,SimpleString *other)

{
  bool bVar1;
  SimpleString local_38;
  SimpleString local_28;
  SimpleString *local_18;
  SimpleString *other_local;
  SimpleString *this_local;
  
  local_18 = other;
  other_local = this;
  lowerCase(&local_28);
  lowerCase(&local_38);
  bVar1 = contains(&local_28,&local_38);
  ~SimpleString(&local_38);
  ~SimpleString(&local_28);
  return bVar1;
}

Assistant:

bool SimpleString::containsNoCase(const SimpleString& other) const
{
    return lowerCase().contains(other.lowerCase());
}